

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

int equal_dimensions_and_border(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b)

{
  bool local_11;
  YV12_BUFFER_CONFIG *b_local;
  YV12_BUFFER_CONFIG *a_local;
  
  local_11 = false;
  if (((((a->field_1).field_0.y_height == (b->field_1).field_0.y_height) &&
       (local_11 = false, (a->field_0).field_0.y_width == (b->field_0).field_0.y_width)) &&
      (local_11 = false, (a->field_1).field_0.uv_height == (b->field_1).field_0.uv_height)) &&
     (((local_11 = false, (a->field_0).field_0.uv_width == (b->field_0).field_0.uv_width &&
       (local_11 = false, (a->field_4).field_0.y_stride == (b->field_4).field_0.y_stride)) &&
      ((local_11 = false, (a->field_4).field_0.uv_stride == (b->field_4).field_0.uv_stride &&
       (local_11 = false, a->border == b->border)))))) {
    local_11 = (a->flags & 8U) == (b->flags & 8U);
  }
  return (int)local_11;
}

Assistant:

static inline int equal_dimensions_and_border(const YV12_BUFFER_CONFIG *a,
                                              const YV12_BUFFER_CONFIG *b) {
  return a->y_height == b->y_height && a->y_width == b->y_width &&
         a->uv_height == b->uv_height && a->uv_width == b->uv_width &&
         a->y_stride == b->y_stride && a->uv_stride == b->uv_stride &&
         a->border == b->border &&
         (a->flags & YV12_FLAG_HIGHBITDEPTH) ==
             (b->flags & YV12_FLAG_HIGHBITDEPTH);
}